

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

void __thiscall
chrono::ChSystemDescriptor::ConvertToMatrixForm
          (ChSystemDescriptor *this,ChSparseMatrix *Cq,ChSparseMatrix *H,ChSparseMatrix *E,
          ChVectorDynamic<> *Fvector,ChVectorDynamic<> *Bvector,ChVectorDynamic<> *Frict,
          bool only_bilaterals,bool skip_contacts_uv)

{
  double *pdVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  ChConstraint *pCVar8;
  ChVariables *pCVar9;
  double *pdVar10;
  ChKblock *pCVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int iVar19;
  uint uVar20;
  Index size;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ActualDstType actualDst_2;
  long lVar31;
  ChVectorRef local_48;
  
  ppCVar2 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar5 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar21 = (long)ppCVar5 - (long)ppCVar4 >> 3;
  ppCVar6 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar7 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar26 = 0;
  if (ppCVar5 != ppCVar4) {
    lVar31 = 0;
    do {
      pCVar8 = ppCVar4[lVar31];
      if (((pCVar8->active == true) && (!only_bilaterals || pCVar8->mode != CONSTRAINT_FRIC)) &&
         ((pCVar8 == (ChConstraint *)0x0 ||
          (lVar22 = __dynamic_cast(pCVar8,&ChConstraint::typeinfo,
                                   &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe),
          !skip_contacts_uv || lVar22 == 0)))) {
        uVar26 = (ulong)((int)uVar26 + 1);
      }
      lVar31 = lVar31 + 1;
    } while (lVar21 + (ulong)(lVar21 == 0) != lVar31);
    uVar26 = (ulong)(int)uVar26;
  }
  iVar19 = (*this->_vptr_ChSystemDescriptor[7])(this);
  this->n_q = iVar19;
  if (Cq != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(Cq,uVar26,(long)iVar19);
  }
  if (H != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(H,(long)this->n_q,(long)this->n_q);
  }
  if (E != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(E,uVar26,uVar26);
  }
  if (Fvector != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->n_q);
    lVar31 = (Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar31 < 0) goto LAB_007ae868;
    if (lVar31 != 0) {
      memset((Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar31 << 3);
    }
  }
  if (Bvector != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar26);
    lVar31 = (Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar31 < 0) goto LAB_007ae868;
    if (lVar31 != 0) {
      memset((Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar31 << 3);
    }
  }
  if (Frict != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar26);
    lVar31 = (Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar31 < 0) {
LAB_007ae868:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar31 != 0) {
      memset((Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar31 << 3);
    }
  }
  if (ppCVar2 != ppCVar3) {
    lVar31 = (long)ppCVar2 - (long)ppCVar3 >> 3;
    lVar22 = 0;
    uVar26 = 0;
    do {
      pCVar9 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar22];
      if (pCVar9->disabled == false) {
        uVar30 = (uint)uVar26;
        if (H != (ChSparseMatrix *)0x0) {
          (*pCVar9->_vptr_ChVariables[9])(this->c_a,pCVar9,H,uVar26,uVar26);
        }
        if (Fvector != (ChVectorDynamic<> *)0x0) {
          ChVariables::Get_fb(&local_48,
                              (this->vvariables).
                              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar22]);
          uVar20 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar22]->_vptr_ChVariables[2])();
          pdVar10 = (Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          if ((int)uVar20 < 0 && pdVar10 != (double *)0x0) {
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                         );
          }
          uVar26 = (ulong)(int)uVar20;
          if (((int)(uVar20 | uVar30) < 0) ||
             ((long)((Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows - uVar26) < (long)(int)uVar30)) {
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          if (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_ != uVar26) {
            __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                          "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                         );
          }
          pdVar10 = pdVar10 + (int)uVar30;
          uVar25 = uVar26;
          if ((((ulong)pdVar10 & 7) == 0) &&
             (uVar25 = (ulong)(-((uint)((ulong)pdVar10 >> 3) & 0x1fffffff) & 7),
             (long)uVar26 <= (long)uVar25)) {
            uVar25 = uVar26;
          }
          uVar28 = uVar26 - uVar25;
          uVar27 = uVar28 + 7;
          if (-1 < (long)uVar28) {
            uVar27 = uVar28;
          }
          if (0 < (long)uVar25) {
            uVar29 = 0;
            do {
              pdVar10[uVar29] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar29 * 8);
              uVar29 = uVar29 + 1;
            } while (uVar25 != uVar29);
          }
          uVar27 = (uVar27 & 0xfffffffffffffff8) + uVar25;
          if (7 < (long)uVar28) {
            do {
              pdVar23 = (double *)
                        (local_48.
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                         ._0_8_ + uVar25 * 8);
              dVar12 = pdVar23[1];
              dVar13 = pdVar23[2];
              dVar14 = pdVar23[3];
              dVar15 = pdVar23[4];
              dVar16 = pdVar23[5];
              dVar17 = pdVar23[6];
              dVar18 = pdVar23[7];
              pdVar1 = pdVar10 + uVar25;
              *pdVar1 = *pdVar23;
              pdVar1[1] = dVar12;
              pdVar1[2] = dVar13;
              pdVar1[3] = dVar14;
              pdVar1[4] = dVar15;
              pdVar1[5] = dVar16;
              pdVar1[6] = dVar17;
              pdVar1[7] = dVar18;
              uVar25 = uVar25 + 8;
            } while ((long)uVar25 < (long)uVar27);
          }
          if ((long)uVar27 < (long)uVar26) {
            do {
              pdVar10[uVar27] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar27 * 8);
              uVar27 = uVar27 + 1;
            } while (uVar26 != uVar27);
          }
        }
        iVar19 = (*(this->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar22]->_vptr_ChVariables[2])();
        uVar26 = (ulong)(uVar30 + iVar19);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != lVar31 + (ulong)(lVar31 == 0));
  }
  if (ppCVar6 != ppCVar7 && H != (ChSparseMatrix *)0x0) {
    lVar22 = (long)ppCVar6 - (long)ppCVar7 >> 3;
    lVar31 = 0;
    do {
      pCVar11 = (this->vstiffness).
                super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar31];
      (*pCVar11->_vptr_ChKblock[6])(pCVar11,H,1);
      lVar31 = lVar31 + 1;
    } while (lVar22 + (ulong)(lVar22 == 0) != lVar31);
  }
  if (ppCVar5 != ppCVar4) {
    lVar31 = 0;
    uVar26 = 0;
    do {
      pCVar8 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar31];
      if (((pCVar8->active == true) && (!only_bilaterals || pCVar8->mode != CONSTRAINT_FRIC)) &&
         ((pCVar8 == (ChConstraint *)0x0 ||
          (lVar22 = __dynamic_cast(pCVar8,&ChConstraint::typeinfo,
                                   &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe),
          !skip_contacts_uv || lVar22 == 0)))) {
        iVar19 = (int)uVar26;
        if (Cq != (ChSparseMatrix *)0x0) {
          (*pCVar8->_vptr_ChConstraint[0xd])(pCVar8,Cq,uVar26);
        }
        if (E != (ChSparseMatrix *)0x0) {
          (**E->_vptr_SparseMatrix)
                    ((this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->cfm_i,E,uVar26,uVar26,1);
        }
        lVar22 = (long)iVar19;
        if (Bvector != (ChVectorDynamic<> *)0x0) {
          if ((iVar19 < 0) ||
             ((Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar22)) goto LAB_007ae7ec;
          (Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          [lVar22] = (this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->b_i;
        }
        if (Frict != (ChVectorDynamic<> *)0x0) {
          if ((iVar19 < 0) ||
             ((Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar22)) {
LAB_007ae7ec:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar10 = (Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          pdVar10[lVar22] = -2.0;
          pCVar8 = (this->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar31];
          if (pCVar8 == (ChConstraint *)0x0) {
            pdVar23 = (double *)0x0;
          }
          else {
            pdVar23 = (double *)
                      __dynamic_cast(pCVar8,&ChConstraint::typeinfo,
                                     &ChConstraintTwoTuplesContactNall::typeinfo,0xfffffffffffffffe)
            ;
          }
          if (pdVar23 != (double *)0x0) {
            pdVar10[lVar22] = *pdVar23;
          }
          if ((pCVar8 != (ChConstraint *)0x0) &&
             (lVar24 = __dynamic_cast(pCVar8,&ChConstraint::typeinfo,
                                      &ChConstraintTwoTuplesFrictionTall::typeinfo,
                                      0xfffffffffffffffe), lVar24 != 0)) {
            pdVar10[lVar22] = -1.0;
          }
        }
        uVar26 = (ulong)(iVar19 + 1);
      }
      lVar31 = lVar31 + 1;
    } while (lVar21 + (ulong)(lVar21 == 0) != lVar31);
  }
  return;
}

Assistant:

void ChSystemDescriptor::ConvertToMatrixForm(ChSparseMatrix* Cq,
                                             ChSparseMatrix* H,
                                             ChSparseMatrix* E,
                                             ChVectorDynamic<>* Fvector,
                                             ChVectorDynamic<>* Bvector,
                                             ChVectorDynamic<>* Frict,
                                             bool only_bilaterals,
                                             bool skip_contacts_uv) {
    std::vector<ChConstraint*>& mconstraints = GetConstraintsList();
    std::vector<ChVariables*>& mvariables = GetVariablesList();

    auto mv_size = mvariables.size();
    auto mc_size = mconstraints.size();
    auto vs_size = vstiffness.size();

    // Count bilateral and other constraints.. (if wanted, bilaterals only)

    int mn_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            if (!((mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) && only_bilaterals))
                if (!((dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic])) && skip_contacts_uv)) {
                    mn_c++;
                }
    }

    // Count active variables, by scanning through all variable blocks,
    // and set offsets

    n_q = CountActiveVariables();

    // Reset and resize (if needed) auxiliary vectors

    if (Cq)
        Cq->resize(mn_c, n_q);
    if (H)
        H->resize(n_q, n_q);
    if (E)
        E->resize(mn_c, mn_c);
    if (Fvector)
        Fvector->setZero(n_q);
    if (Bvector)
        Bvector->setZero(mn_c);
    if (Frict)
        Frict->setZero(mn_c);

    // Fills H submasses and 'f' vector,
    // by looping on variables
    int s_q = 0;
    for (size_t iv = 0; iv < mv_size; iv++) {
        if (mvariables[iv]->IsActive()) {
            if (H)
                mvariables[iv]->Build_M(*H, s_q, s_q, c_a);  // .. fills  H  (often H=M , the mass)
            if (Fvector)
                Fvector->segment(s_q, vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();  // .. fills  'f'
            s_q += mvariables[iv]->Get_ndof();
        }
    }

    // If some stiffness / hessian matrix has been added to H ,
    // also add it to the sparse H
    if (H) {
        for (size_t ik = 0; ik < vs_size; ik++) {
            vstiffness[ik]->Build_K(*H, true);
        }
    }

    // Fills Cq jacobian, E 'compliance' matrix , the 'b' vector and friction coeff.vector,
    // by looping on constraints
    int s_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            if (!((mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) && only_bilaterals))
                if (!((dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic])) && skip_contacts_uv)) {
                    if (Cq)
                        mconstraints[ic]->Build_Cq(*Cq, s_c);  // .. fills Cq
                    if (E)
                        E->SetElement(s_c, s_c, mconstraints[ic]->Get_cfm_i());  // .. fills E ( = cfm )
                    if (Bvector)
                        (*Bvector)(s_c) = mconstraints[ic]->Get_b_i();  // .. fills 'b'
                    if (Frict)                                          // .. fills vector of friction coefficients
                    {
                        (*Frict)(s_c) = -2;  // mark with -2 flag for bilaterals (default)
                        if (auto mcon = dynamic_cast<ChConstraintTwoTuplesContactNall*>(mconstraints[ic]))
                            (*Frict)(s_c) =
                                mcon->GetFrictionCoefficient();  // friction coeff only in row of normal component
                        if (dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic]))
                            (*Frict)(s_c) = -1;  // mark with -1 flag for rows of tangential components
                    }
                    s_c++;
                }
    }
}